

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void RemoveLocal(CService *addr)

{
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<GlobalMutex> criticalblock20;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<GlobalMutex>::UniqueLock
            (&criticalblock20,&g_maplocalhost_mutex,"g_maplocalhost_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x12f,false);
  CService::ToStringAddrPort_abi_cxx11_(&local_38,addr);
  logging_function._M_str = "RemoveLocal";
  logging_function._M_len = 0xb;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
  source_file._M_len = 0x57;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,0x130,ALL,Info,(ConstevalFormatString<1U>)0x686e7b,
             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::erase(&mapLocalHost._M_t,&addr->super_CNetAddr);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock20.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RemoveLocal(const CService& addr)
{
    LOCK(g_maplocalhost_mutex);
    LogPrintf("RemoveLocal(%s)\n", addr.ToStringAddrPort());
    mapLocalHost.erase(addr);
}